

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O2

void duckdb::ListUniqueFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  char cVar1;
  reference pvVar2;
  BoundFunctionExpression *pBVar3;
  pointer pFVar4;
  pointer pEVar5;
  BoundAggregateExpression *pBVar6;
  FunctionLocalState *pFVar7;
  UnifiedVectorFormat *pUVar8;
  Vector *pVVar9;
  long lVar10;
  ulong uVar11;
  reference pvVar12;
  long lVar13;
  ulong uVar14;
  VectorType VVar15;
  idx_t child_idx;
  ulong uVar16;
  UnifiedVectorFormat *pUVar17;
  long *plVar18;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2a8;
  UnifiedVectorFormat *local_2a0;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false> state_buffer;
  SelectionVector sel_vector;
  AggregateInputData aggr_input_data;
  LogicalType local_220 [24];
  StateVector state_vector;
  UnifiedVectorFormat lists_data;
  long local_188;
  long local_180;
  Vector slice;
  char local_147;
  Vector state_vector_update;
  long local_c0;
  UnifiedVectorFormat child_data;
  
  pUVar17 = *(UnifiedVectorFormat **)(args + 0x18);
  pvVar2 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  VVar15 = (VectorType)result;
  duckdb::Vector::SetVectorType(VVar15);
  FlatVector::VerifyFlatVector(result);
  if (pvVar2[8] == (value_type)0x1) {
    duckdb::Vector::SetVectorType(VVar15);
    duckdb::ConstantVector::SetNull(result,true);
    return;
  }
  pBVar3 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pFVar4 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                       *)(pBVar3 + 0x198));
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)(pFVar4 + 0x20));
  pBVar6 = BaseExpression::Cast<duckdb::BoundAggregateExpression>((BaseExpression *)pEVar5);
  state_vector.count = *(idx_t *)(state + 0xb0);
  pFVar7 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->
                     ((optional_ptr<duckdb::FunctionLocalState,_true> *)&state_vector);
  duckdb::ArenaAllocator::Reset();
  aggr_input_data.bind_data.ptr = *(FunctionData **)(pBVar6 + 0x1a0);
  aggr_input_data.combine_type = PRESERVE_INPUT;
  aggr_input_data.allocator = (ArenaAllocator *)(pFVar7 + 8);
  pUVar8 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(pvVar2);
  pVVar9 = (Vector *)duckdb::ListVector::GetEntry(pvVar2);
  duckdb::Vector::Flatten((ulong)pVVar9);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&child_data);
  duckdb::Vector::ToUnifiedFormat((ulong)pVVar9,pUVar8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&lists_data);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar2,pUVar17);
  lVar10 = (**(code **)(pBVar6 + 0x108))();
  state_buffer.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
       operator_new__(lVar10 * (long)pUVar17);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)(pFVar4 + 0x20));
  (**(code **)(*(long *)pEVar5 + 0x88))(&local_2a8,pEVar5);
  StateVector::StateVector
            (&state_vector,(idx_t)pUVar17,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_2a8);
  if (local_2a8._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)local_2a8._M_head_impl + 8))();
  }
  local_2a8._M_head_impl = (Expression *)0x0;
  duckdb::LogicalType::LogicalType(local_220,POINTER);
  duckdb::Vector::Vector(&state_vector_update,local_220,0x800);
  duckdb::LogicalType::~LogicalType(local_220);
  SelectionVector::SelectionVector(&sel_vector,0x800);
  uVar14 = 0;
  local_2a0 = pUVar17;
  for (pUVar8 = (UnifiedVectorFormat *)0x0; pUVar17 = local_2a0, pUVar8 != local_2a0;
      pUVar8 = pUVar8 + 1) {
    lVar13 = (long)pUVar8 * lVar10 +
             (long)state_buffer.
                   super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    *(long *)(state_vector._48_8_ + (long)pUVar8 * 8) = lVar13;
    (**(code **)(pBVar6 + 0x110))(pBVar6 + 0x58);
    pUVar17 = pUVar8;
    if (*_lists_data != 0) {
      pUVar17 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_lists_data + (long)pUVar8 * 4);
    }
    if ((local_180 == 0) ||
       ((*(ulong *)(local_180 + ((ulong)pUVar17 >> 6) * 8) >> ((ulong)pUVar17 & 0x3f) & 1) != 0)) {
      plVar18 = (long *)((long)pUVar17 * 0x10 + local_188);
      uVar11 = plVar18[1];
      if (uVar11 != 0) {
        for (uVar16 = 0; uVar16 < uVar11; uVar16 = uVar16 + 1) {
          if (uVar14 == 0x800) {
            duckdb::Vector::Vector(&slice,pVVar9,&sel_vector,0x800);
            (**(code **)(pBVar6 + 0x118))(&slice,&aggr_input_data,1,&state_vector_update,0x800);
            Vector::~Vector(&slice);
            uVar14 = 0;
          }
          uVar11 = *plVar18 + uVar16;
          if (*_child_data != 0) {
            uVar11 = (ulong)*(uint *)(*_child_data + uVar11 * 4);
          }
          sel_vector.sel_vector[uVar14] = (sel_t)uVar11;
          *(long *)(local_c0 + uVar14 * 8) = lVar13;
          uVar14 = uVar14 + 1;
          uVar11 = plVar18[1];
        }
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar8);
    }
  }
  if (uVar14 != 0) {
    duckdb::Vector::Vector(&slice,pVVar9,&sel_vector,uVar14);
    (**(code **)(pBVar6 + 0x118))(&slice,&aggr_input_data,1,&state_vector_update,uVar14);
    Vector::~Vector(&slice);
  }
  pvVar12 = vector<duckdb::LogicalType,_true>::get<true>
                      ((vector<duckdb::LogicalType,_true> *)(pBVar6 + 0xa0),0);
  duckdb::LogicalType::LogicalType((LogicalType *)&slice,pvVar12);
  switch(local_147) {
  case '\x01':
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,bool,std::unordered_map<bool,unsigned_long,std::hash<bool>,std::equal_to<bool>,std::allocator<std::pair<bool_const,unsigned_long>>>>
              (result,&state_vector.state_vector,(idx_t)pUVar17);
    break;
  case '\x02':
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_char,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>>
              (result,&state_vector.state_vector,(idx_t)pUVar17);
    break;
  case '\x03':
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,signed_char,std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>
              (result,&state_vector.state_vector,(idx_t)pUVar17);
    break;
  case '\x04':
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_short,std::unordered_map<unsigned_short,unsigned_long,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_long>>>>
              (result,&state_vector.state_vector,(idx_t)pUVar17);
    break;
  case '\x05':
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,short,std::unordered_map<short,unsigned_long,std::hash<short>,std::equal_to<short>,std::allocator<std::pair<short_const,unsigned_long>>>>
              (result,&state_vector.state_vector,(idx_t)pUVar17);
    break;
  case '\x06':
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_int,std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>
              (result,&state_vector.state_vector,(idx_t)pUVar17);
    break;
  case '\a':
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,int,std::unordered_map<int,unsigned_long,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,unsigned_long>>>>
              (result,&state_vector.state_vector,(idx_t)pUVar17);
    break;
  case '\b':
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_long,std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
              (result,&state_vector.state_vector,(idx_t)pUVar17);
    break;
  case '\t':
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,long,std::unordered_map<long,unsigned_long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,unsigned_long>>>>
              (result,&state_vector.state_vector,(idx_t)pUVar17);
    break;
  case '\v':
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,float,std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>
              (result,&state_vector.state_vector,(idx_t)pUVar17);
    break;
  case '\f':
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,double,std::unordered_map<double,unsigned_long,std::hash<double>,std::equal_to<double>,std::allocator<std::pair<double_const,unsigned_long>>>>
              (result,&state_vector.state_vector,(idx_t)pUVar17);
    break;
  default:
    if (local_147 == -0x38) {
      UniqueFunctor::
      ListExecuteFunction<duckdb::FinalizeStringValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
                (result,&state_vector.state_vector,(idx_t)pUVar17);
      break;
    }
  case '\n':
    UniqueFunctor::
    ListExecuteFunction<duckdb::FinalizeGenericValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
              (result,&state_vector.state_vector,(idx_t)pUVar17);
  }
  duckdb::LogicalType::~LogicalType((LogicalType *)&slice);
  cVar1 = duckdb::DataChunk::AllConstant();
  if (cVar1 != '\0') {
    duckdb::Vector::SetVectorType(VVar15);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sel_vector.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Vector::~Vector(&state_vector_update);
  StateVector::~StateVector(&state_vector);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (&state_buffer.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
  ;
  UnifiedVectorFormat::~UnifiedVectorFormat(&lists_data);
  UnifiedVectorFormat::~UnifiedVectorFormat(&child_data);
  return;
}

Assistant:

static void ListUniqueFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 1);
	ListAggregatesFunction<UniqueFunctor>(args, state, result);
}